

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdGetTapBranchHandle
              (void *handle,void *tree_handle,uint8_t index_from_leaf,char **branch_hash,
              void **branch_tree_handle)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  size_type sVar4;
  void *pvVar5;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  reference this_00;
  undefined8 *in_RCX;
  byte in_DL;
  long in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  value_type *dest_tree;
  TaprootScriptTree tree;
  ByteData256 hash_obj;
  TapBranch *branch_data;
  uint32_t max;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  TapBranch *branch;
  CfdCapiTapscriptTree *buffer;
  CfdCapiTapscriptTree *work_branch_buffer;
  char *work_branch_hash;
  int result;
  size_type in_stack_fffffffffffffd28;
  TaprootScriptTree *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  size_type in_stack_fffffffffffffd48;
  CfdError CVar6;
  CfdException *in_stack_fffffffffffffd50;
  vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *this_01;
  reference in_stack_fffffffffffffd90;
  uint32_t in_stack_fffffffffffffdec;
  string *in_stack_fffffffffffffdf0;
  pointer in_stack_fffffffffffffe38;
  pointer in_stack_fffffffffffffe40;
  undefined1 local_192 [2];
  string local_190 [32];
  string local_170;
  ByteData256 local_150;
  reference local_138;
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  CfdSourceLocation local_108;
  uint local_ec;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_e8;
  reference local_d0;
  long local_c8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  allocator local_79;
  string local_78 [48];
  void *local_48;
  char *local_40;
  undefined4 local_34;
  undefined8 *local_30;
  undefined8 *local_28;
  byte local_19;
  long local_18;
  int local_4;
  
  local_34 = 0xffffffff;
  local_40 = (char *)0x0;
  local_48 = (void *)0x0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_19 = in_DL;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"TapscriptTree",&local_79);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if (local_30 == (undefined8 *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffd48 >> 0x20);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x3d1;
    local_98.funcname = "CfdGetTapBranchHandle";
    cfd::core::logger::warn<>(&local_98,"branch_tree_handle is null or empty.");
    local_ba = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"Failed to parameter. branch_tree_handle is null or empty.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,CVar6,
               (string *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    local_ba = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_c8 = local_18;
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_18 + 0x18));
  if (bVar1) {
    in_stack_fffffffffffffd90 =
         std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
         at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *)
            in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    local_d0 = in_stack_fffffffffffffd90;
  }
  else {
    local_d0 = (reference)
               std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                         ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                          in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  cfd::core::TapBranch::GetBranchList(&local_e8,&local_d0->super_TapBranch);
  sVar4 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size(&local_e8);
  local_ec = (uint)sVar4;
  if (local_ec <= local_19) {
    local_108.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffd48 >> 0x20);
    local_108.filename = local_108.filename + 1;
    local_108.line = 0x3e2;
    local_108.funcname = "CfdGetTapBranchHandle";
    cfd::core::logger::warn<>(&local_108,"index_from_leaf is out of range.");
    local_12a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_128,"Failed to parameter. index_from_leaf is out of range.",&local_129);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,CVar6,
               (string *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    local_12a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_138 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                        ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                         in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_150,local_138);
  if (local_28 != (undefined8 *)0x0) {
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_170,&local_150);
    local_40 = cfd::capi::CreateString((string *)in_stack_fffffffffffffd90);
    std::__cxx11::string::~string((string *)&local_170);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"TapscriptTree",(allocator *)(local_192 + 1));
  local_48 = cfd::capi::AllocBuffer(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)(local_192 + 1));
  pvVar5 = operator_new(0x18);
  this_01 = (vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *)
            local_192;
  std::allocator<cfd::core::TaprootScriptTree>::allocator
            ((allocator<cfd::core::TaprootScriptTree> *)0x59d922);
  std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::vector
            (this_01,in_stack_fffffffffffffd48,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  *(void **)((long)local_48 + 0x10) = pvVar5;
  std::allocator<cfd::core::TaprootScriptTree>::~allocator
            ((allocator<cfd::core::TaprootScriptTree> *)0x59d95e);
  this = (vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)operator_new(0x18);
  (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::vector(this);
  *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)((long)local_48 + 0x18) =
       this;
  uVar2 = cfd::core::TapBranch::HasTapLeaf(local_138);
  if ((bool)uVar2) {
    cfd::core::TaprootScriptTree::TaprootScriptTree
              ((TaprootScriptTree *)&stack0xfffffffffffffdd8,local_138);
    this_00 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                  *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    cfd::core::TaprootScriptTree::operator=(this_00,(TaprootScriptTree *)&stack0xfffffffffffffdd8);
    cfd::core::TaprootScriptTree::~TaprootScriptTree(in_stack_fffffffffffffd30);
  }
  else {
    std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
    emplace_back<cfd::core::TapBranch&>
              (*(vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> **)
                ((long)local_48 + 0x18),local_138);
  }
  *local_30 = local_48;
  if (local_28 != (undefined8 *)0x0) {
    *local_28 = local_40;
  }
  local_4 = 0;
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x59db2f);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
             CONCAT17(uVar2,in_stack_fffffffffffffd40));
  return local_4;
}

Assistant:

int CfdGetTapBranchHandle(
    void* handle, void* tree_handle, uint8_t index_from_leaf,
    char** branch_hash, void** branch_tree_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_branch_hash = nullptr;
  CfdCapiTapscriptTree* work_branch_buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (branch_tree_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "branch_tree_handle is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. branch_tree_handle is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TapBranch* branch;
    if (!buffer->branch_buffer->empty()) {
      branch = &buffer->branch_buffer->at(0);
    } else {
      branch = &buffer->tree_buffer->at(0);
    }

    auto branches = branch->GetBranchList();
    uint32_t max = static_cast<uint32_t>(branches.size());
    if (max <= index_from_leaf) {
      warn(CFD_LOG_SOURCE, "index_from_leaf is out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index_from_leaf is out of range.");
    }
    TapBranch& branch_data = branches.at(index_from_leaf);
    ByteData256 hash_obj = branch_data.GetCurrentBranchHash();
    if (branch_hash != nullptr) {
      work_branch_hash = CreateString(hash_obj.GetHex());
    }

    work_branch_buffer = static_cast<CfdCapiTapscriptTree*>(
        AllocBuffer(kPrefixTapscriptTree, sizeof(CfdCapiTapscriptTree)));
    work_branch_buffer->tree_buffer = new std::vector<TaprootScriptTree>(1);
    work_branch_buffer->branch_buffer = new std::vector<TapBranch>();
    if (branch_data.HasTapLeaf()) {
      TaprootScriptTree tree(branch_data);
      auto& dest_tree = work_branch_buffer->tree_buffer->at(0);
      dest_tree = tree;
    } else {
      work_branch_buffer->branch_buffer->emplace_back(branch_data);
    }

    *branch_tree_handle = work_branch_buffer;
    if (branch_hash != nullptr) *branch_hash = work_branch_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_branch_hash);
  CfdFreeTaprootScriptTreeHandle(handle, work_branch_buffer);
  return result;
}